

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

CBlockUndo *
GetUndoChecked(CBlockUndo *__return_storage_ptr__,BlockManager *blockman,CBlockIndex *blockindex)

{
  bool bVar1;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  unique_lock<std::recursive_mutex> local_60;
  string local_50;
  CBlockUndo *local_30;
  
  local_30 = *(CBlockUndo **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (blockindex->nHeight != 0) {
    local_60._M_device = &cs_main.super_recursive_mutex;
    local_60._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_60);
    bVar1 = node::BlockManager::IsBlockPruned(blockman,blockindex);
    if (bVar1) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Undo data not available (pruned data)","");
      JSONRPCError(pUVar2,-1,&local_50);
      if (*(CBlockUndo **)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002d18af;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_60);
    bVar1 = node::BlockManager::UndoReadFromDisk(blockman,__return_storage_ptr__,blockindex);
    if (!bVar1) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Can\'t read undo data from disk","");
      JSONRPCError(pUVar2,-1,&local_50);
      if (*(CBlockUndo **)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002d18af;
    }
  }
  if (*(CBlockUndo **)(in_FS_OFFSET + 0x28) == local_30) {
    return *(CBlockUndo **)(in_FS_OFFSET + 0x28);
  }
LAB_002d18af:
  __stack_chk_fail();
}

Assistant:

static CBlockUndo GetUndoChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    CBlockUndo blockUndo;

    // The Genesis block does not have undo data
    if (blockindex.nHeight == 0) return blockUndo;

    {
        LOCK(cs_main);
        if (blockman.IsBlockPruned(blockindex)) {
            throw JSONRPCError(RPC_MISC_ERROR, "Undo data not available (pruned data)");
        }
    }

    if (!blockman.UndoReadFromDisk(blockUndo, blockindex)) {
        throw JSONRPCError(RPC_MISC_ERROR, "Can't read undo data from disk");
    }

    return blockUndo;
}